

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

void __thiscall Quat4f::normalize(Quat4f *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int in_ESI;
  float extraout_XMM0_Da;
  float fVar4;
  
  abs(this,in_ESI);
  fVar4 = 1.0 / extraout_XMM0_Da;
  fVar1 = this->m_elements[1];
  fVar2 = this->m_elements[2];
  fVar3 = this->m_elements[3];
  this->m_elements[0] = fVar4 * this->m_elements[0];
  this->m_elements[1] = fVar4 * fVar1;
  this->m_elements[2] = fVar4 * fVar2;
  this->m_elements[3] = fVar4 * fVar3;
  return;
}

Assistant:

void Quat4f::normalize()
{
	float reciprocalAbs = 1.f / abs();

	m_elements[ 0 ] *= reciprocalAbs;
	m_elements[ 1 ] *= reciprocalAbs;
	m_elements[ 2 ] *= reciprocalAbs;
	m_elements[ 3 ] *= reciprocalAbs;
}